

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
dynet::MatrixMultiply::backward_dev_impl<dynet::Device_CPU>
          (MatrixMultiply *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppTVar4;
  Tensor *pTVar5;
  Tensor *pTVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  int iVar36;
  int iVar37;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_78;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x463,
                  "void dynet::MatrixMultiply::backward_dev_impl(const MyDevice &, const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  ppTVar4 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar5 = *ppTVar4;
  pTVar6 = ppTVar4[1];
  uVar14 = (pTVar6->d).bd;
  uVar18 = (pTVar5->d).bd;
  uVar16 = uVar14;
  if (uVar14 < uVar18) {
    uVar16 = uVar18;
  }
  local_78 = xs;
  if (i == 0) {
    if (((dEdxi->d).bd == 1) && ((dEdf->d).bd == uVar14)) {
      uVar17 = (ulong)(dEdf->d).d[0];
      uVar16 = 1;
      uVar18 = 1;
      if (1 < (dEdf->d).nd) {
        uVar18 = (dEdf->d).d[1];
      }
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(uVar18 * uVar14);
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pTVar6->v;
      uVar19 = (ulong)(pTVar6->d).d[0];
      if (1 < (pTVar6->d).nd) {
        uVar16 = (pTVar6->d).d[1];
      }
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(uVar16 * uVar14);
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = uVar17;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = uVar19;
      if (uVar18 * uVar14 != uVar16 * uVar14) {
LAB_0034e38d:
        pcVar15 = 
        "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
        ;
        goto LAB_0034e3a2;
      }
      Tensor::operator*(&local_70,dEdxi);
      if ((local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != uVar17) ||
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != uVar19)) {
LAB_0034e3af:
        pcVar15 = 
        "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
        ;
        goto LAB_0034e3c4;
      }
      Eigen::internal::
      generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_70,&local_b8,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_98);
    }
    else if (0 < (int)uVar16) {
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 0;
      do {
        uVar18 = (dEdf->d).nd;
        iVar36 = 1;
        if ((ulong)uVar18 != 0) {
          auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar25 = vpbroadcastq_avx512f();
          uVar17 = 0;
          do {
            auVar26 = vpbroadcastq_avx512f();
            auVar27 = vmovdqa64_avx512f(auVar24);
            auVar24 = vporq_avx512f(auVar26,auVar22);
            auVar26 = vporq_avx512f(auVar26,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
            bVar12 = (byte)uVar10;
            uVar20 = CONCAT11(bVar12,bVar11);
            auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar17));
            auVar26._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
            auVar26._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
            auVar26._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
            auVar26._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
            auVar26._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
            auVar26._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
            auVar26._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
            auVar26._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
            auVar26._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
            auVar26._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
            auVar26._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
            auVar26._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
            auVar26._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
            auVar26._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
            auVar26._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
            auVar26._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
            uVar17 = uVar17 + 0x10;
            auVar24 = vpmulld_avx512f(auVar26,auVar27);
          } while (((ulong)uVar18 + 0xf & 0x1fffffff0) != uVar17);
          auVar24 = vmovdqa32_avx512f(auVar24);
          auVar25._0_4_ =
               (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
          bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar25._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
          bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar25._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
          bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar25._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
          bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar25._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
          bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar25._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
          bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar25._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
          bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
          auVar25._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
          auVar25._32_4_ =
               (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar25._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar25._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar25._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar25._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar25._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar25._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
          auVar25._60_4_ =
               (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
          auVar21 = vextracti64x4_avx512f(auVar25,1);
          auVar24 = vpmulld_avx512f(auVar25,ZEXT3264(auVar21));
          auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar36 = auVar8._0_4_;
        }
        iVar37 = 1;
        pTVar5 = (local_78->
                 super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[1];
        uVar1 = (dEdf->d).d[1];
        if (uVar18 < 2) {
          uVar1 = 1;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar1;
        uVar18 = (pTVar5->d).nd;
        if ((ulong)uVar18 != 0) {
          auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar25 = vpbroadcastq_avx512f();
          uVar17 = 0;
          do {
            auVar26 = vpbroadcastq_avx512f();
            auVar27 = vmovdqa64_avx512f(auVar24);
            auVar24 = vporq_avx512f(auVar26,auVar22);
            auVar26 = vporq_avx512f(auVar26,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
            bVar12 = (byte)uVar10;
            uVar20 = CONCAT11(bVar12,bVar11);
            auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar5->d).d + uVar17));
            auVar33._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
            auVar33._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
            auVar33._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
            auVar33._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
            auVar33._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
            auVar33._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
            auVar33._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
            auVar33._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
            auVar33._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
            auVar33._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
            auVar33._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
            auVar33._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
            auVar33._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
            auVar33._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
            auVar33._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
            auVar33._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
            uVar17 = uVar17 + 0x10;
            auVar24 = vpmulld_avx512f(auVar33,auVar27);
          } while (((ulong)uVar18 + 0xf & 0x1fffffff0) != uVar17);
          auVar24 = vmovdqa32_avx512f(auVar24);
          auVar34._0_4_ =
               (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
          bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
          bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
          bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
          bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
          bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
          bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
          bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
          auVar34._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
          auVar34._32_4_ =
               (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar34._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar34._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar34._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar34._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar34._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar34._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
          auVar34._60_4_ =
               (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
          auVar21 = vextracti64x4_avx512f(auVar34,1);
          auVar24 = vpmulld_avx512f(auVar34,ZEXT3264(auVar21));
          auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar37 = auVar8._0_4_;
        }
        uVar2 = (dEdf->d).d[0];
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar2;
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar14 % (dEdf->d).bd) * iVar36;
        uVar3 = (pTVar5->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar3;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar5->v + (uVar14 % (pTVar5->d).bd) * iVar37;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar5->d).d[1];
        if (uVar18 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if (uVar1 != (uint)local_98.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_cols.m_value) goto LAB_0034e38d;
        uVar18 = (dEdxi->d).nd;
        if ((ulong)uVar18 == 0) {
          iVar36 = 1;
        }
        else {
          auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar25 = vpbroadcastq_avx512f();
          uVar17 = 0;
          do {
            auVar26 = vpbroadcastq_avx512f();
            auVar27 = vmovdqa64_avx512f(auVar24);
            auVar24 = vporq_avx512f(auVar26,auVar22);
            auVar26 = vporq_avx512f(auVar26,auVar23);
            uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
            bVar12 = (byte)uVar10;
            uVar20 = CONCAT11(bVar12,bVar11);
            auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar17));
            auVar35._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
            auVar35._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
            auVar35._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
            auVar35._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
            auVar35._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
            auVar35._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
            auVar35._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
            auVar35._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
            auVar35._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
            auVar35._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
            auVar35._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
            auVar35._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
            auVar35._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
            auVar35._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
            auVar35._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
            auVar35._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
            uVar17 = uVar17 + 0x10;
            auVar24 = vpmulld_avx512f(auVar35,auVar27);
          } while (((ulong)uVar18 + 0xf & 0x1fffffff0) != uVar17);
          auVar22 = vmovdqa32_avx512f(auVar24);
          auVar23._0_4_ =
               (uint)(bVar11 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
          bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar23._4_4_ = (uint)bVar7 * auVar22._4_4_ | (uint)!bVar7 * auVar27._4_4_;
          bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar23._8_4_ = (uint)bVar7 * auVar22._8_4_ | (uint)!bVar7 * auVar27._8_4_;
          bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar23._12_4_ = (uint)bVar7 * auVar22._12_4_ | (uint)!bVar7 * auVar27._12_4_;
          bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar23._16_4_ = (uint)bVar7 * auVar22._16_4_ | (uint)!bVar7 * auVar27._16_4_;
          bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar23._20_4_ = (uint)bVar7 * auVar22._20_4_ | (uint)!bVar7 * auVar27._20_4_;
          bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar23._24_4_ = (uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * auVar27._24_4_;
          bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
          auVar23._28_4_ = (uint)bVar7 * auVar22._28_4_ | (uint)!bVar7 * auVar27._28_4_;
          auVar23._32_4_ =
               (uint)(bVar12 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar23._36_4_ = (uint)bVar7 * auVar22._36_4_ | (uint)!bVar7 * auVar27._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar23._40_4_ = (uint)bVar7 * auVar22._40_4_ | (uint)!bVar7 * auVar27._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar23._44_4_ = (uint)bVar7 * auVar22._44_4_ | (uint)!bVar7 * auVar27._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar23._48_4_ = (uint)bVar7 * auVar22._48_4_ | (uint)!bVar7 * auVar27._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar23._52_4_ = (uint)bVar7 * auVar22._52_4_ | (uint)!bVar7 * auVar27._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar23._56_4_ = (uint)bVar7 * auVar22._56_4_ | (uint)!bVar7 * auVar27._56_4_;
          auVar23._60_4_ =
               (uint)(bVar12 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
          auVar21 = vextracti64x4_avx512f(auVar23,1);
          auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar21));
          auVar8 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar36 = auVar8._0_4_;
        }
        uVar1 = (dEdxi->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar1;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar14 % (dEdxi->d).bd) * iVar36;
        uVar13 = (dEdxi->d).d[1];
        if (uVar18 < 2) {
          uVar13 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar13;
        if ((uVar1 != uVar2) || (uVar3 != uVar13)) goto LAB_0034e3af;
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,&local_b8,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_98);
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar16);
    }
  }
  else if (uVar18 == 1) {
    Tensor::operator*(&local_70,pTVar5);
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdf->v;
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdf->d).d[0];
    uVar14 = 1;
    if (1 < (dEdf->d).nd) {
      uVar14 = (dEdf->d).d[1];
    }
    uVar14 = uVar14 * (dEdf->d).bd;
    local_98.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)uVar14;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    if (local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value !=
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) {
LAB_0034e35f:
      pcVar15 = 
      "Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
      ;
LAB_0034e3a2:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar15);
    }
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = dEdxi->v;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value = (long)(dEdxi->d).d[0];
    uVar18 = 1;
    if (1 < (dEdxi->d).nd) {
      uVar18 = (dEdxi->d).d[1];
    }
    uVar18 = uVar18 * (dEdxi->d).bd;
    local_50.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)uVar18;
    if ((local_70.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) || (uVar14 != uVar18)) {
LAB_0034e376:
      pcVar15 = 
      "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
      ;
LAB_0034e3c4:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar15);
    }
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
              (&local_50,
               (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_b8,&local_98);
  }
  else if (0 < (int)uVar16) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar14 = 0;
    do {
      iVar36 = 1;
      pTVar5 = *(local_78->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = (pTVar5->d).nd;
      if ((ulong)uVar18 != 0) {
        auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar25 = vpbroadcastq_avx512f();
        uVar17 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar24);
          auVar24 = vporq_avx512f(auVar26,auVar22);
          auVar26 = vporq_avx512f(auVar26,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
          bVar12 = (byte)uVar10;
          uVar20 = CONCAT11(bVar12,bVar11);
          auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar5->d).d + uVar17));
          auVar28._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
          auVar28._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
          auVar28._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
          auVar28._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
          auVar28._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
          auVar28._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
          auVar28._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
          auVar28._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
          auVar28._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
          auVar28._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
          uVar17 = uVar17 + 0x10;
          auVar24 = vpmulld_avx512f(auVar28,auVar27);
        } while (((ulong)uVar18 + 0xf & 0x1fffffff0) != uVar17);
        auVar24 = vmovdqa32_avx512f(auVar24);
        auVar29._0_4_ =
             (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
        bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
        bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
        bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
        bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar29._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
        bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar29._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
        bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar29._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
        bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar29._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
        auVar29._32_4_ =
             (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar29._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar29._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar29._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar29._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar29._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar29._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
        auVar29._60_4_ =
             (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
        auVar21 = vextracti64x4_avx512f(auVar29,1);
        auVar24 = vpmulld_avx512f(auVar29,ZEXT3264(auVar21));
        auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar36 = auVar8._0_4_;
      }
      uVar1 = (dEdf->d).nd;
      iVar37 = 1;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(pTVar5->d).d[1];
      if (uVar18 < 2) {
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      if ((ulong)uVar1 != 0) {
        auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar25 = vpbroadcastq_avx512f();
        uVar17 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar24);
          auVar24 = vporq_avx512f(auVar26,auVar22);
          auVar26 = vporq_avx512f(auVar26,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
          bVar12 = (byte)uVar10;
          uVar20 = CONCAT11(bVar12,bVar11);
          auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar17));
          auVar30._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
          auVar30._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
          auVar30._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
          auVar30._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
          auVar30._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
          auVar30._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
          auVar30._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
          auVar30._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
          auVar30._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
          auVar30._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
          uVar17 = uVar17 + 0x10;
          auVar24 = vpmulld_avx512f(auVar30,auVar27);
        } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar17);
        auVar24 = vmovdqa32_avx512f(auVar24);
        auVar31._0_4_ =
             (uint)(bVar11 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
        bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * auVar27._4_4_;
        bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * auVar27._8_4_;
        bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * auVar27._12_4_;
        bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar31._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * auVar27._16_4_;
        bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar31._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * auVar27._20_4_;
        bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar31._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * auVar27._24_4_;
        bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar31._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * auVar27._28_4_;
        auVar31._32_4_ =
             (uint)(bVar12 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar31._36_4_ = (uint)bVar7 * auVar24._36_4_ | (uint)!bVar7 * auVar27._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar31._40_4_ = (uint)bVar7 * auVar24._40_4_ | (uint)!bVar7 * auVar27._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar31._44_4_ = (uint)bVar7 * auVar24._44_4_ | (uint)!bVar7 * auVar27._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar31._48_4_ = (uint)bVar7 * auVar24._48_4_ | (uint)!bVar7 * auVar27._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar31._52_4_ = (uint)bVar7 * auVar24._52_4_ | (uint)!bVar7 * auVar27._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar31._56_4_ = (uint)bVar7 * auVar24._56_4_ | (uint)!bVar7 * auVar27._56_4_;
        auVar31._60_4_ =
             (uint)(bVar12 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
        auVar21 = vextracti64x4_avx512f(auVar31,1);
        auVar24 = vpmulld_avx512f(auVar31,ZEXT3264(auVar21));
        auVar8 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar37 = auVar8._0_4_;
      }
      uVar18 = (pTVar5->d).d[0];
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar18;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pTVar5->v + (uVar14 % (pTVar5->d).bd) * iVar36;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v + (uVar14 % (dEdf->d).bd) * iVar37;
      uVar2 = (dEdf->d).d[0];
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar2;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdf->d).d[1];
      if (uVar1 < 2) {
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      if (uVar18 != uVar2) goto LAB_0034e35f;
      uVar18 = (dEdxi->d).nd;
      if ((ulong)uVar18 == 0) {
        iVar36 = 1;
      }
      else {
        auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar25 = vpbroadcastq_avx512f();
        uVar17 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar24);
          auVar24 = vporq_avx512f(auVar26,auVar22);
          auVar26 = vporq_avx512f(auVar26,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar24,auVar25,2);
          bVar12 = (byte)uVar10;
          uVar20 = CONCAT11(bVar12,bVar11);
          auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar17));
          auVar32._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
          auVar32._0_4_ = (uint)(bVar11 & 1) * auVar24._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
          auVar32._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar24._28_4_;
          auVar32._32_4_ = (uint)(bVar12 & 1) * auVar24._32_4_;
          auVar32._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar24._36_4_;
          auVar32._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar24._40_4_;
          auVar32._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar24._44_4_;
          auVar32._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar24._48_4_;
          auVar32._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar24._52_4_;
          auVar32._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar24._56_4_;
          auVar32._60_4_ = (uint)(bVar12 >> 7) * auVar24._60_4_;
          uVar17 = uVar17 + 0x10;
          auVar24 = vpmulld_avx512f(auVar32,auVar27);
        } while (((ulong)uVar18 + 0xf & 0x1fffffff0) != uVar17);
        auVar22 = vmovdqa32_avx512f(auVar24);
        auVar24._0_4_ =
             (uint)(bVar11 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
        bVar7 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar7 * auVar22._4_4_ | (uint)!bVar7 * auVar27._4_4_;
        bVar7 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar7 * auVar22._8_4_ | (uint)!bVar7 * auVar27._8_4_;
        bVar7 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar7 * auVar22._12_4_ | (uint)!bVar7 * auVar27._12_4_;
        bVar7 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar24._16_4_ = (uint)bVar7 * auVar22._16_4_ | (uint)!bVar7 * auVar27._16_4_;
        bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar24._20_4_ = (uint)bVar7 * auVar22._20_4_ | (uint)!bVar7 * auVar27._20_4_;
        bVar7 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar24._24_4_ = (uint)bVar7 * auVar22._24_4_ | (uint)!bVar7 * auVar27._24_4_;
        bVar7 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar24._28_4_ = (uint)bVar7 * auVar22._28_4_ | (uint)!bVar7 * auVar27._28_4_;
        auVar24._32_4_ =
             (uint)(bVar12 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar27._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar24._36_4_ = (uint)bVar7 * auVar22._36_4_ | (uint)!bVar7 * auVar27._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar24._40_4_ = (uint)bVar7 * auVar22._40_4_ | (uint)!bVar7 * auVar27._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar24._44_4_ = (uint)bVar7 * auVar22._44_4_ | (uint)!bVar7 * auVar27._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar24._48_4_ = (uint)bVar7 * auVar22._48_4_ | (uint)!bVar7 * auVar27._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar24._52_4_ = (uint)bVar7 * auVar22._52_4_ | (uint)!bVar7 * auVar27._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar24._56_4_ = (uint)bVar7 * auVar22._56_4_ | (uint)!bVar7 * auVar27._56_4_;
        auVar24._60_4_ =
             (uint)(bVar12 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar27._60_4_;
        auVar21 = vextracti64x4_avx512f(auVar24,1);
        auVar22 = vpmulld_avx512f(auVar24,ZEXT3264(auVar21));
        auVar8 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        iVar36 = auVar8._0_4_;
      }
      uVar1 = (dEdxi->d).d[0];
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)uVar1;
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v + (uVar14 % (dEdxi->d).bd) * iVar36;
      uVar2 = (dEdxi->d).d[1];
      if (uVar18 < 2) {
        uVar2 = 1;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)uVar2;
      if ((uVar1 != (uint)local_b8.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value) ||
         ((uint)local_98.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value != uVar2)) goto LAB_0034e376;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_70,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_b8,&local_98);
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar16);
  }
  return;
}

Assistant:

void MatrixMultiply::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < 2);
  int max_b = max(xs[0]->d.bd, xs[1]->d.bd);
#if __CUDACC__
  if (i == 0) {
    if(dEdxi.d.bd == 1 && (dEdf.d.bd == xs[1]->d.bd)) {
      CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols() * dEdf.d.batch_elems(),
            kSCALAR_ONE,
            dEdf.v, dEdf.d.rows(),
            xs[1]->v, xs[1]->d.rows(),
            kSCALAR_ONE, dEdxi.v, dEdxi.d.rows()));
    } else {
      for(int b = 0; b < max_b; ++b)
        CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
              dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
              kSCALAR_ONE,
              dEdf.batch_ptr(b), dEdf.d.rows(),
              xs[1]->batch_ptr(b), xs[1]->d.rows(),
              kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
    }
  } else {
    // Do a single multiply if xs[0] has one batch
    if(xs[0]->d.bd == 1) {
      // dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
      CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols()*dEdxi.d.batch_elems(), xs[0]->d.rows(),
            kSCALAR_ONE,
            xs[0]->v, xs[0]->d.rows(),
            dEdf.v, dEdf.d.rows(),
            kSCALAR_ONE, dEdxi.v, dEdxi.d.rows()));
    } else {
      for(int b = 0; b < max_b; ++b)
        CUBLAS_CHECK(cublasSgemm(dev.cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
              dEdxi.d.rows(), dEdxi.d.cols(), xs[0]->d.rows(),
              kSCALAR_ONE,
              xs[0]->batch_ptr(b), xs[0]->d.rows(),
              dEdf.batch_ptr(b), dEdf.d.rows(),
              kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
    }
  }
#else
  if (i == 0) {
    if(dEdxi.d.bd == 1 && (dEdf.d.bd == xs[1]->d.bd)) {
      (*dEdxi).noalias() += dEdf.colbatch_matrix() * xs[1]->colbatch_matrix().transpose();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[1]->batch_matrix(b).transpose();
    }
  } else {
    if(xs[0]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[0]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[0]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
  }
#endif
}